

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  Mem t;
  MemValue local_78;
  char *pcStack_70;
  undefined8 local_68;
  sqlite3 *psStack_60;
  undefined8 local_58;
  char *pcStack_50;
  _func_void_void_ptr *local_48;
  sqlite3_context local_40;
  
  local_40.pOut = (Mem *)&local_78;
  local_40.pVdbe = (Vdbe *)0x0;
  local_40.iOp = 0;
  local_40.isError = 0;
  local_40.argv[0] = (sqlite3_value *)0x0;
  local_78.r = 0.0;
  pcStack_70 = (char *)0x0;
  local_58 = 0;
  pcStack_50 = (char *)0x0;
  local_48 = (_func_void_void_ptr *)0x0;
  local_68 = 0x100000000;
  psStack_60 = pMem->db;
  local_40._41_7_ = 0;
  local_40.enc = psStack_60->enc;
  local_40.pFunc = pFunc;
  local_40.pMem = pMem;
  (*pFunc->xFinalize)(&local_40);
  if (0 < pMem->szMalloc) {
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  pMem->xDel = local_48;
  pMem->szMalloc = (undefined4)local_58;
  pMem->uTemp = local_58._4_4_;
  pMem->zMalloc = pcStack_50;
  pMem->n = (undefined4)local_68;
  pMem->flags = local_68._4_2_;
  pMem->enc = local_68._6_1_;
  pMem->eSubtype = local_68._7_1_;
  pMem->db = psStack_60;
  (pMem->u).r = (double)local_78;
  pMem->z = pcStack_70;
  return local_40.isError;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  sqlite3_context ctx;
  Mem t;
  assert( pFunc!=0 );
  assert( pMem!=0 );
  assert( pMem->db!=0 );
  assert( pFunc->xFinalize!=0 );
  assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
  assert( sqlite3_mutex_held(pMem->db->mutex) );
  memset(&ctx, 0, sizeof(ctx));
  memset(&t, 0, sizeof(t));
  t.flags = MEM_Null;
  t.db = pMem->db;
  ctx.pOut = &t;
  ctx.pMem = pMem;
  ctx.pFunc = pFunc;
  ctx.enc = ENC(t.db);
  pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
  assert( (pMem->flags & MEM_Dyn)==0 );
  if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
  memcpy(pMem, &t, sizeof(t));
  return ctx.isError;
}